

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O3

Rgba __thiscall EnvmapImage::sample(EnvmapImage *this,V2f *pos)

{
  int iVar1;
  Rgba *pRVar2;
  Rgba RVar3;
  Rgba RVar4;
  Rgba RVar5;
  Rgba RVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  fVar23 = pos->x;
  if (0.0 <= fVar23) {
    iVar11 = (int)fVar23;
  }
  else {
    fVar22 = -fVar23;
    iVar11 = -((uint)((float)(int)fVar22 < fVar22) + (int)fVar22);
  }
  iVar12 = iVar11 + 1;
  fVar23 = (float)iVar12 - fVar23;
  iVar1 = (this->_dataWindow).min.x;
  iVar8 = (this->_dataWindow).max.x;
  iVar10 = iVar8;
  if (iVar11 < iVar8) {
    iVar10 = iVar11;
  }
  iVar10 = iVar10 - iVar1;
  if (iVar11 < iVar1) {
    iVar10 = 0;
  }
  fVar22 = 1.0 - fVar23;
  if (iVar12 < iVar8) {
    iVar8 = iVar12;
  }
  iVar11 = iVar8 - iVar1;
  if (iVar12 < iVar1) {
    iVar11 = 0;
  }
  fVar25 = pos->y;
  if (0.0 <= fVar25) {
    iVar12 = (int)fVar25;
  }
  else {
    fVar24 = -fVar25;
    iVar12 = -((uint)((float)(int)fVar24 < fVar24) + (int)fVar24);
  }
  iVar1 = iVar12 + 1;
  iVar8 = (this->_dataWindow).min.y;
  iVar15 = (this->_dataWindow).max.y;
  iVar18 = iVar15;
  if (iVar12 < iVar15) {
    iVar18 = iVar12;
  }
  iVar18 = iVar18 - iVar8;
  if (iVar12 < iVar8) {
    iVar18 = 0;
  }
  fVar25 = (float)iVar1 - fVar25;
  if (iVar1 < iVar15) {
    iVar15 = iVar1;
  }
  iVar12 = iVar15 - iVar8;
  if (iVar1 < iVar8) {
    iVar12 = 0;
  }
  fVar21 = 1.0 - fVar25;
  pRVar2 = (this->_pixels)._data;
  lVar17 = (this->_pixels)._sizeY;
  lVar14 = iVar18 * lVar17;
  RVar3 = pRVar2[lVar14 + iVar10];
  RVar4 = pRVar2[lVar14 + iVar11];
  lVar17 = iVar12 * lVar17;
  RVar5 = pRVar2[lVar17 + iVar10];
  RVar6 = pRVar2[lVar17 + iVar11];
  fVar26 = (*(float *)(_imath_half_to_float_table + (ulong)(RVar3._0_4_ & 0xffff) * 4) * fVar23 +
           *(float *)(_imath_half_to_float_table + (ulong)(RVar4._0_4_ & 0xffff) * 4) * fVar22) *
           fVar25 + (*(float *)(_imath_half_to_float_table + (ulong)(RVar5._0_4_ & 0xffff) * 4) *
                     fVar23 + *(float *)(_imath_half_to_float_table +
                                        (ulong)(RVar6._0_4_ & 0xffff) * 4) * fVar22) * fVar21;
  fVar24 = ABS(fVar26);
  uVar9 = (uint)fVar26 >> 0x10 & 0x8000;
  if ((uint)fVar24 < 0x38800000) {
    if ((0x33000000 < (uint)fVar24) &&
       (uVar19 = (uint)fVar24 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar24 >> 0x17),
       uVar9 = uVar9 | uVar19 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar19 << (cVar7 + 0xa2U & 0x1f))) {
      uVar9 = uVar9 + 1;
    }
  }
  else if ((uint)fVar24 < 0x7f800000) {
    if ((uint)fVar24 < 0x477ff000) {
      uVar9 = (int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd | uVar9;
    }
    else {
      uVar9 = uVar9 | 0x7c00;
    }
  }
  else {
    uVar9 = uVar9 | 0x7c00;
    if (fVar24 != INFINITY) {
      uVar19 = (uint)fVar24 >> 0xd & 0x3ff;
      uVar9 = uVar9 | uVar19 | (uint)(uVar19 == 0);
    }
  }
  fVar26 = (*(float *)(_imath_half_to_float_table + (ulong)(RVar3._2_4_ & 0xffff) * 4) * fVar23 +
           *(float *)(_imath_half_to_float_table + (ulong)(RVar4._2_4_ & 0xffff) * 4) * fVar22) *
           fVar25 + (*(float *)(_imath_half_to_float_table + (ulong)(RVar5._2_4_ & 0xffff) * 4) *
                     fVar23 + *(float *)(_imath_half_to_float_table +
                                        (ulong)(RVar6._2_4_ & 0xffff) * 4) * fVar22) * fVar21;
  fVar24 = ABS(fVar26);
  uVar19 = (uint)fVar26 >> 0x10 & 0x8000;
  if ((uint)fVar24 < 0x38800000) {
    if ((0x33000000 < (uint)fVar24) &&
       (uVar20 = (uint)fVar24 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar24 >> 0x17),
       uVar19 = uVar19 | uVar20 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar20 << (cVar7 + 0xa2U & 0x1f))) {
      uVar19 = uVar19 + 1;
    }
  }
  else if ((uint)fVar24 < 0x7f800000) {
    if ((uint)fVar24 < 0x477ff000) {
      uVar19 = (int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd | uVar19;
    }
    else {
      uVar19 = uVar19 | 0x7c00;
    }
  }
  else {
    uVar19 = uVar19 | 0x7c00;
    if (fVar24 != INFINITY) {
      uVar20 = (uint)fVar24 >> 0xd & 0x3ff;
      uVar19 = uVar19 | uVar20 | (uint)(uVar20 == 0);
    }
  }
  fVar26 = (*(float *)(_imath_half_to_float_table + (ulong)(RVar3._4_4_ & 0xffff) * 4) * fVar23 +
           *(float *)(_imath_half_to_float_table + (ulong)(RVar4._4_4_ & 0xffff) * 4) * fVar22) *
           fVar25 + (*(float *)(_imath_half_to_float_table + (ulong)(RVar5._4_4_ & 0xffff) * 4) *
                     fVar23 + *(float *)(_imath_half_to_float_table +
                                        (ulong)(RVar6._4_4_ & 0xffff) * 4) * fVar22) * fVar21;
  fVar24 = ABS(fVar26);
  uVar20 = (uint)fVar26 >> 0x10 & 0x8000;
  if ((uint)fVar24 < 0x38800000) {
    if ((0x33000000 < (uint)fVar24) &&
       (uVar13 = (uint)fVar24 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar24 >> 0x17),
       uVar20 = uVar20 | uVar13 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar13 << (cVar7 + 0xa2U & 0x1f))) {
      uVar20 = uVar20 + 1;
    }
  }
  else if ((uint)fVar24 < 0x7f800000) {
    if ((uint)fVar24 < 0x477ff000) {
      uVar20 = (int)fVar24 + 0x8000fff + (uint)(((uint)fVar24 >> 0xd & 1) != 0) >> 0xd | uVar20;
    }
    else {
      uVar20 = uVar20 | 0x7c00;
    }
  }
  else {
    uVar20 = uVar20 | 0x7c00;
    if (fVar24 != INFINITY) {
      uVar13 = (uint)fVar24 >> 0xd & 0x3ff;
      uVar20 = uVar20 | uVar13 | (uint)(uVar13 == 0);
    }
  }
  fVar22 = (*(float *)(_imath_half_to_float_table + ((ulong)RVar3 >> 0x30) * 4) * fVar23 +
           *(float *)(_imath_half_to_float_table + ((ulong)RVar4 >> 0x30) * 4) * fVar22) * fVar25 +
           fVar21 * (fVar23 * *(float *)(_imath_half_to_float_table + ((ulong)RVar5 >> 0x30) * 4) +
                    fVar22 * *(float *)(_imath_half_to_float_table + ((ulong)RVar6 >> 0x30) * 4));
  fVar23 = ABS(fVar22);
  uVar13 = (uint)fVar22 >> 0x10 & 0x8000;
  if ((uint)fVar23 < 0x38800000) {
    if ((0x33000000 < (uint)fVar23) &&
       (uVar16 = (uint)fVar23 & 0x7fffff | 0x800000, cVar7 = (char)((uint)fVar23 >> 0x17),
       uVar13 = uVar13 | uVar16 >> (0x7eU - cVar7 & 0x1f),
       0x80000000 < uVar16 << (cVar7 + 0xa2U & 0x1f))) {
      uVar13 = uVar13 + 1;
    }
  }
  else if ((uint)fVar23 < 0x7f800000) {
    if ((uint)fVar23 < 0x477ff000) {
      uVar13 = (int)fVar23 + 0x8000fff + (uint)(((uint)fVar23 >> 0xd & 1) != 0) >> 0xd | uVar13;
    }
    else {
      uVar13 = uVar13 | 0x7c00;
    }
  }
  else {
    uVar13 = uVar13 | 0x7c00;
    if (fVar23 != INFINITY) {
      uVar16 = (uint)fVar23 >> 0xd & 0x3ff;
      uVar13 = uVar13 | uVar16 | (uint)(uVar16 == 0);
    }
  }
  return (Rgba)((ulong)(uVar9 & 0xffff) |
               (ulong)(uVar19 << 0x10) |
               (ulong)(uVar20 & 0xffff) << 0x20 | (ulong)(uVar13 & 0xffff) << 0x30);
}

Assistant:

Rgba
EnvmapImage::sample (const V2f& pos) const
{
    //
    // Point-sample the environment map image at 2D position pos.
    // Interpolate bilinearly between the four nearest pixels.
    //

    int   x1 = IMATH::floor (pos.x);
    int   x2 = x1 + 1;
    float sx = x2 - pos.x;
    float tx = 1 - sx;

    x1 = clamp (x1, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;
    x2 = clamp (x2, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;

    int   y1 = IMATH::floor (pos.y);
    int   y2 = y1 + 1;
    float sy = y2 - pos.y;
    float ty = 1 - sy;

    y1 = clamp (y1, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;
    y2 = clamp (y2, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;

    Rgba p11 = _pixels[y1][x1];
    Rgba p12 = _pixels[y1][x2];
    Rgba p21 = _pixels[y2][x1];
    Rgba p22 = _pixels[y2][x2];

    Rgba p;
    p.r = (p11.r * sx + p12.r * tx) * sy + (p21.r * sx + p22.r * tx) * ty;
    p.g = (p11.g * sx + p12.g * tx) * sy + (p21.g * sx + p22.g * tx) * ty;
    p.b = (p11.b * sx + p12.b * tx) * sy + (p21.b * sx + p22.b * tx) * ty;
    p.a = (p11.a * sx + p12.a * tx) * sy + (p21.a * sx + p22.a * tx) * ty;

    return p;
}